

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MatrixStrideValidator::validateSingleVariable
          (MatrixStrideValidator *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path,string *resource,GLint propValue,string *implementationName)

{
  ostringstream *poVar1;
  pointer pVVar2;
  pointer pVVar3;
  GLint GVar4;
  MatrixOrder MVar5;
  int iVar6;
  DataType DVar7;
  bool bVar8;
  allocator<char> local_1b5;
  GLint local_1b4;
  undefined1 local_1b0 [384];
  
  pVVar2 = (path->
           super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (path->
           super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar2->m_type == TYPE_INTERFACEBLOCK) {
    bVar8 = ((pVVar2->m_data).block)->storage - STORAGE_UNIFORM < 2;
  }
  else {
    bVar8 = false;
  }
  DVar7 = ((pVVar3[-1].m_data.block)->layout).offset;
  if ((bVar8 == false) || (8 < DVar7 - TYPE_FLOAT_MAT2 && 8 < DVar7 - TYPE_DOUBLE_MAT2)) {
    local_1b0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Verifying matrix stride, expecting ");
    iVar6 = -(uint)(byte)(DVar7 != TYPE_UINT_ATOMIC_COUNTER & ~bVar8);
    std::ostream::operator<<(poVar1,iVar6);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    if (iVar6 == propValue) {
      return;
    }
    local_1b0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"\tError, got ");
    std::ostream::operator<<(poVar1,propValue);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"resource matrix stride invalid",&local_1b5);
    PropValidator::setError((PropValidator *)this,(string *)local_1b0);
  }
  else {
    MVar5 = getMatrixOrderFromPath(path);
    local_1b4 = propValue;
    if (MVar5 == MATRIXORDER_ROW_MAJOR) {
      iVar6 = glu::getDataTypeMatrixNumColumns(DVar7);
    }
    else {
      iVar6 = glu::getDataTypeMatrixNumRows(DVar7);
    }
    DVar7 = glu::getDataTypeScalarType(((pVVar3[-1].m_data.block)->layout).offset);
    local_1b0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Verifying matrix stride, expecting greater or equal to ");
    iVar6 = (uint)((DVar7 == TYPE_BOOL || DVar7 == TYPE_FLOAT) ||
                  (DVar7 & ~TYPE_FLOAT_VEC4) == TYPE_INT) * iVar6 * 4;
    std::ostream::operator<<(poVar1,iVar6);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    GVar4 = local_1b4;
    if (iVar6 <= local_1b4) {
      return;
    }
    local_1b0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"\tError, got ");
    std::ostream::operator<<(poVar1,GVar4);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"resource matrix stride invalid",&local_1b5);
    PropValidator::setError((PropValidator *)this,(string *)local_1b0);
  }
  std::__cxx11::string::~string((string *)local_1b0);
  return;
}

Assistant:

void MatrixStrideValidator::validateSingleVariable (const std::vector<VariablePathComponent>& path, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	const VariablePathComponent&	component			= path.back();
	const VariablePathComponent&	firstComponent		= path.front();

	const bool						isBufferBlock		= firstComponent.isInterfaceBlock() && isBufferBackedInterfaceBlockStorage(firstComponent.getInterfaceBlock()->storage);
	const bool						isMatrix			= glu::isDataTypeMatrix(component.getVariableType()->getBasicType());

	DE_UNREF(resource);
	DE_UNREF(implementationName);

	// Layout tests will verify layouts of buffer backed arrays properly. Here we just check the stride is is greater or equal to the row/column size
	if (isBufferBlock && isMatrix)
	{
		const bool	columnMajor			= getMatrixOrderFromPath(path) != glu::MATRIXORDER_ROW_MAJOR;
		const int	numMajorElements	= (columnMajor) ? (glu::getDataTypeMatrixNumRows(component.getVariableType()->getBasicType())) : (glu::getDataTypeMatrixNumColumns(component.getVariableType()->getBasicType()));
		const int	majorSize			= numMajorElements * getTypeSize(glu::getDataTypeScalarType(component.getVariableType()->getBasicType()));

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying matrix stride, expecting greater or equal to " << majorSize << tcu::TestLog::EndMessage;

		if (propValue < majorSize)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
			setError("resource matrix stride invalid");
		}
	}
	else
	{
		const int matrixStride = (!isBufferBlock && !glu::isDataTypeAtomicCounter(component.getVariableType()->getBasicType())) ? (-1) : (0);

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying matrix stride, expecting " << matrixStride << tcu::TestLog::EndMessage;

		if (matrixStride != propValue)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
			setError("resource matrix stride invalid");
		}
	}
}